

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O3

void cfd::core::ConvertFromUniValue<long>(long *value,UniValue *json_value)

{
  char *pcVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  string *psVar5;
  int64_t iVar6;
  CfdException *this;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  UniValue json_value_copy;
  string local_100;
  UniValue local_e0;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  char local_70 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<UniValue,_std::allocator<UniValue>_> local_48;
  
  local_88._0_4_ = json_value->typ;
  local_80._M_p = local_70;
  pcVar2 = (json_value->val)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + (json_value->val)._M_string_length);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,&json_value->keys);
  ::std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_48,&json_value->values);
  if (local_88._0_4_ != VSTR) goto LAB_004c45dc;
  psVar5 = UniValue::get_str_abi_cxx11_(json_value);
  iVar4 = ::std::__cxx11::string::compare((char *)psVar5);
  if (iVar4 == 0) {
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"0","");
    UniValue::UniValue(&local_e0,VNUM,&local_100);
    local_88._0_4_ = local_e0.typ;
    ::std::__cxx11::string::_M_assign((string *)&local_80);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_60,&local_e0.keys);
    ::std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&local_48,&local_e0.values);
    UniValue::~UniValue(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    goto LAB_004c45dc;
  }
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  uVar11 = (ulong)(*pcVar3 == '-');
  pcVar1 = pcVar3 + psVar5->_M_string_length;
  uVar7 = psVar5->_M_string_length - uVar11;
  lVar10 = (long)uVar7 >> 2;
  uVar8 = uVar11;
  if (0 < lVar10) {
    uVar8 = uVar7 & 0xfffffffffffffffc | uVar11;
    lVar10 = lVar10 + 1;
    pcVar9 = pcVar3 + uVar11 + 1;
    do {
      if ((int)pcVar9[-1] - 0x3aU < 0xfffffff6) {
        pcVar9 = pcVar9 + -1;
        goto LAB_004c457b;
      }
      if ((int)*pcVar9 - 0x3aU < 0xfffffff6) goto LAB_004c457b;
      if ((int)pcVar9[1] - 0x3aU < 0xfffffff6) {
        pcVar9 = pcVar9 + 1;
        goto LAB_004c457b;
      }
      if ((int)pcVar9[2] - 0x3aU < 0xfffffff6) {
        pcVar9 = pcVar9 + 2;
        goto LAB_004c457b;
      }
      lVar10 = lVar10 + -1;
      pcVar9 = pcVar9 + 4;
    } while (1 < lVar10);
  }
  pcVar9 = pcVar3 + uVar8;
  lVar10 = (long)pcVar1 - (long)pcVar9;
  if (lVar10 == 1) {
LAB_004c455b:
    if (0xfffffff5 < (int)*pcVar9 - 0x3aU) {
      pcVar9 = pcVar1;
    }
LAB_004c457b:
    if (pcVar9 != pcVar1) goto LAB_004c45dc;
  }
  else {
    if (lVar10 == 2) {
LAB_004c454d:
      if (0xfffffff5 < (int)*pcVar9 - 0x3aU) {
        pcVar9 = pcVar9 + 1;
        goto LAB_004c455b;
      }
      goto LAB_004c457b;
    }
    if (lVar10 == 3) {
      if (0xfffffff5 < (int)*pcVar9 - 0x3aU) {
        pcVar9 = pcVar9 + 1;
        goto LAB_004c454d;
      }
      goto LAB_004c457b;
    }
  }
  psVar5 = UniValue::get_str_abi_cxx11_(json_value);
  UniValue::UniValue(&local_e0,VNUM,psVar5);
  local_88._0_4_ = local_e0.typ;
  ::std::__cxx11::string::_M_assign((string *)&local_80);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&local_60,&local_e0.keys);
  ::std::vector<UniValue,_std::allocator<UniValue>_>::operator=(&local_48,&local_e0.values);
  UniValue::~UniValue(&local_e0);
LAB_004c45dc:
  if (local_88._0_4_ != VNUM) {
    local_e0._0_8_ = "cfdcore_json_mapping_base.h";
    local_e0.val._M_dataplus._M_p._0_4_ = 0x100;
    local_e0.val._M_string_length = 0x622a45;
    logger::log<>((CfdSourceLocation *)&local_e0,kCfdLogLevelWarning,"Invalid json format.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_e0._0_8_ = &local_e0.val._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Json value convert error. Invalid json format.","");
    CfdException::CfdException(this,kCfdOutOfRangeError,(string *)&local_e0);
    __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar6 = UniValue::get_int64((UniValue *)local_88);
  *value = iVar6;
  UniValue::~UniValue((UniValue *)local_88);
  return;
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    const auto& str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}